

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

char * flatcc_verify_error_string(int err)

{
  if ((uint)err < 0x26) {
    return &DAT_00127ac4 + *(int *)(&DAT_00127ac4 + (ulong)(uint)err * 4);
  }
  return "unknown";
}

Assistant:

const char *flatcc_verify_error_string(int err)
{
    switch (err) {
#define XX(no, str)                                                         \
    case flatcc_verify_error_##no:                                          \
        return str;
        FLATCC_VERIFY_ERROR_MAP(XX)
#undef XX
    default:
        return "unknown";
    }
}